

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O3

ShaderExecutor *
deqp::gles31::Functional::anon_unknown_1::createGetConstantExecutor
          (RenderContext *renderCtx,ShaderType shaderType,DataType dataType,string *varName,
          string *extName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  long *plVar4;
  ShaderExecutor *pSVar5;
  size_type *psVar6;
  string local_130;
  string *local_110;
  ShaderType local_104;
  VarType local_100;
  Symbol local_e0;
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_110 = extName;
  local_104 = shaderType;
  ctxType.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_a8._0_4_ = bVar2 | GLSL_VERSION_310_ES;
  local_100._0_8_ = (long)&local_100 + 0x10;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"result = ","");
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_100,(ulong)(varName->_M_dataplus)._M_p);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_130.field_2._M_allocated_capacity = *psVar6;
    local_130.field_2._8_8_ = plVar4[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar6;
    local_130._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_130._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  paVar1 = &local_e0.name.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_e0.name.field_2._M_allocated_capacity = *psVar6;
    local_e0.name.field_2._8_8_ = plVar4[3];
    local_e0.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.name.field_2._M_allocated_capacity = *psVar6;
    local_e0.name._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e0.name._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.name._M_dataplus._M_p,local_e0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_100._0_8_ != (long)&local_100 + 0x10U) {
    operator_delete((void *)local_100._0_8_,local_100.m_data._8_8_ + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"result","");
  glu::VarType::VarType(&local_100,dataType,PRECISION_HIGHP);
  gls::ShaderExecUtil::Symbol::Symbol(&local_e0,&local_130,&local_100);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              *)(local_a8 + 0x20),&local_e0);
  glu::VarType::~VarType(&local_e0.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.name._M_dataplus._M_p,local_e0.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_110->_M_string_length == 0) goto LAB_006090d9;
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)local_110);
    if (iVar3 == 0) goto LAB_006090d9;
    iVar3 = std::__cxx11::string::compare((char *)local_110);
    if (iVar3 == 0) goto LAB_006090d9;
    iVar3 = std::__cxx11::string::compare((char *)local_110);
    if (iVar3 == 0) goto LAB_006090d9;
  }
  std::operator+(&local_130,"#extension ",local_110);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_e0.name.field_2._M_allocated_capacity = *psVar6;
    local_e0.name.field_2._8_8_ = plVar4[3];
    local_e0.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.name.field_2._M_allocated_capacity = *psVar6;
    local_e0.name._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e0.name._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.name._M_dataplus._M_p,local_e0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
LAB_006090d9:
  pSVar5 = gls::ShaderExecUtil::createExecutor(renderCtx,local_104,(ShaderSpec *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
  return pSVar5;
}

Assistant:

static gls::ShaderExecUtil::ShaderExecutor* createGetConstantExecutor (const glu::RenderContext&	renderCtx,
																	   glu::ShaderType				shaderType,
																	   glu::DataType				dataType,
																	   const std::string&			varName,
																	   const std::string&			extName)
{
	using namespace gls::ShaderExecUtil;

	const bool	supportsES32	= contextSupports(renderCtx.getType(), glu::ApiType::es(3, 2));
	ShaderSpec	shaderSpec;

	shaderSpec.version	= supportsES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	shaderSpec.source	= string("result = ") + varName + ";\n";

	shaderSpec.outputs.push_back(Symbol("result", glu::VarType(dataType, glu::PRECISION_HIGHP)));

	if (!extName.empty() && !(supportsES32 && (extName == "GL_OES_sample_variables" || extName == "GL_EXT_geometry_shader" || extName == "GL_EXT_tessellation_shader")))
		shaderSpec.globalDeclarations = "#extension " + extName + " : require\n";

	return createExecutor(renderCtx, shaderType, shaderSpec);
}